

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::GradX<double>
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *coord,
          TPZVec<double> *xiInterior,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double dVar2;
  _func_int **pp_Var3;
  double dVar4;
  bool bVar5;
  int iVar6;
  MElementType MVar7;
  int iVar8;
  int64_t iVar9;
  double *pdVar10;
  int *side_00;
  long lVar11;
  int *piVar12;
  TPZBaseMatrix *in_RCX;
  TPZFMatrix<double> *in_RDI;
  int j_3;
  int i_2;
  int j_2;
  int x_5;
  TPZFMatrix<double> *gradLinSubSide;
  TPZFMatrix<double> *gradNonLinSubSide;
  int xi_2;
  TPZFNMatrix<3,_double> dCorrFactorSideDxiProjMat;
  TPZFNMatrix<3,_double> dCorrFactorSideDxi;
  TPZManVector<double,_3> dCorrFactorSideDxiProj;
  double blendFactorSide;
  int subSide;
  int subSideIndex;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  int x_4;
  TPZFNMatrix<9,_double> gradNeigh_1;
  TPZManVector<double,_3> Xside;
  TPZFNMatrix<9,_double> dNeighXiDXi_1;
  TPZManVector<double,_3> neighXi_1;
  int sidedim;
  int iXi;
  TPZManVector<double,_3> dCorrFactor;
  int j_1;
  int i_1;
  int xi_1;
  int x_3;
  int x_2;
  int x_1;
  int currentNode;
  int iNode_1;
  TPZFNMatrix<9,_double> gradLinSideXiSide;
  TPZManVector<double,_3> nodeCoord;
  TPZFNMatrix<9,_double> dXiProjectedOverSideDxi;
  TPZFNMatrix<9,_double> dXprojDxiSide;
  TPZFNMatrix<9,_double> dSidePhiDSideXiVec;
  TPZFNMatrix<9,_double> sidePhiVec;
  int sideDim;
  int nSideNodes;
  MElementType sideType;
  bool regularMap;
  TPZFNMatrix<9,_double> transfXiToSideXi;
  TPZManVector<double,_3> sideXi;
  TPZGeoElSide gelside;
  int side;
  TPZFMatrix<double> *gradLinSide;
  TPZFMatrix<double> *gradNonLinSide;
  TPZManVector<double,_3> xiProjectedOverSide;
  int sideIndex;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<27,_double> dCorrFactorDxi;
  TPZManVector<double,_20> blendFactor;
  TPZVec<TPZFMatrix<double>_> gradLinSideVec;
  TPZVec<TPZFMatrix<double>_> gradNonLinSideVec;
  int j;
  int i;
  int xi;
  int x;
  int iNode;
  TPZFNMatrix<45,_double> gradXLin;
  TPZFNMatrix<9,_double> dPhiDxi;
  TPZFNMatrix<9,_double> phi;
  TPZFNMatrix<9,_double> gradNeigh;
  TPZFNMatrix<9,_double> dNeighXiDXi;
  TPZManVector<double,_3> neighXi;
  REAL zero;
  TPZGeoMesh *gmesh;
  TPZGeoEl *gel;
  int in_stack_ffffffffffffe2cc;
  TPZManVector<double,_20> *in_stack_ffffffffffffe2d0;
  TPZGeoMesh *in_stack_ffffffffffffe2d8;
  TPZGeoMesh *in_stack_ffffffffffffe2e0;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_ffffffffffffe2e8;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffe2f0;
  double *in_stack_ffffffffffffe2f8;
  TPZManVector<double,_20> *in_stack_ffffffffffffe300;
  TPZFMatrix<double> *in_stack_ffffffffffffe308;
  TPZFNMatrix<45,_double> *in_stack_ffffffffffffe310;
  _func_int **in_stack_ffffffffffffe318;
  TPZFMatrix<double> *in_stack_ffffffffffffe320;
  TPZFMatrix<double> *in_stack_ffffffffffffe328;
  TPZFMatrix<double> *in_stack_ffffffffffffe330;
  TPZVec<double> *in_stack_ffffffffffffe338;
  TPZVec<TPZFMatrix<double>_> *in_stack_ffffffffffffe340;
  double *in_stack_ffffffffffffe370;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_ffffffffffffe378;
  undefined4 in_stack_ffffffffffffe524;
  TPZVec<double> *in_stack_ffffffffffffe528;
  int in_stack_ffffffffffffe534;
  TPZVec<double> *in_stack_ffffffffffffe558;
  double *in_stack_ffffffffffffe560;
  TPZVec<double> *in_stack_ffffffffffffe568;
  int in_stack_ffffffffffffe5c0;
  int in_stack_ffffffffffffe5c4;
  int in_stack_ffffffffffffe5c8;
  int in_stack_ffffffffffffe5cc;
  TPZFMatrix<double> *in_stack_ffffffffffffe5d0;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_ffffffffffffe5d8;
  int local_1a1c;
  TPZFMatrix<double> *in_stack_ffffffffffffe6c0;
  TPZVec<double> *in_stack_ffffffffffffe6c8;
  TPZGeoElSide *in_stack_ffffffffffffe6d0;
  size_t in_stack_ffffffffffffe6e8;
  char *in_stack_ffffffffffffe6f0;
  TPZVec<double> local_18a0;
  double local_1868;
  int local_1860;
  int local_185c;
  TPZVec<int> local_1858 [2];
  TPZVec<int> local_1810 [2];
  int local_17c4;
  undefined8 local_16b0;
  TPZVec<double> local_16a8 [10];
  int local_1558;
  int local_1554;
  undefined8 local_1550;
  TPZVec<double> local_1548;
  int local_1510;
  int local_150c;
  int local_1508;
  int local_1504;
  int local_1500;
  int local_14fc;
  int local_14f8;
  int local_14f4;
  undefined8 local_14f0;
  TPZVec<double> local_1408;
  undefined8 local_13d0;
  undefined8 local_12e8;
  int local_1040;
  int local_103c;
  MElementType local_1038;
  undefined1 local_1031;
  undefined4 local_f14;
  TPZGeoElSide local_f10;
  int local_ef4;
  TPZFMatrix<double> *local_ef0;
  TPZFMatrix<double> *local_ee8;
  undefined8 local_ee0;
  TPZVec<double> local_ed8;
  int local_e9c;
  undefined8 local_e98;
  undefined8 local_d20;
  undefined8 local_ba8;
  undefined8 local_a30;
  TPZVec<double> local_a28 [6];
  undefined8 local_968;
  TPZVec<TPZFMatrix<double>_> local_7f0;
  undefined8 local_7d0;
  TPZVec<TPZFMatrix<double>_> local_658;
  int local_634;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  undefined8 local_620;
  undefined8 local_38;
  TPZGeoMesh *local_30;
  TPZGeoEl *local_28;
  TPZBaseMatrix *local_20;
  
  local_28 = (TPZGeoEl *)in_RDI->fElem;
  local_20 = in_RCX;
  local_30 = TPZGeoEl::Mesh(local_28);
  local_38 = 0x3d06849b86a12b9b;
  (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xe])(local_20,3,2);
  iVar9 = TPZGeoElSideIndex::ElementIndex((TPZGeoElSideIndex *)&in_RDI->fWork);
  iVar6 = (int)((ulong)in_stack_ffffffffffffe318 >> 0x20);
  if (iVar9 == -1) {
    TPZFNMatrix<9,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe2f0,(int64_t)in_stack_ffffffffffffe2e8,
               (int64_t)in_stack_ffffffffffffe2e0);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe2f0,(int64_t)in_stack_ffffffffffffe2e8,
               (int64_t)in_stack_ffffffffffffe2e0);
    pztopology::TPZTriangle::TShape<double>
              ((TPZVec<double> *)in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,
               (TPZFMatrix<double> *)in_stack_ffffffffffffe300);
    local_620 = 0;
    TPZFNMatrix<45,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe310,(int64_t)in_stack_ffffffffffffe308,
               (int64_t)in_stack_ffffffffffffe300,in_stack_ffffffffffffe2f8);
    for (local_624 = 0; local_624 < 3; local_624 = local_624 + 1) {
      for (local_628 = 0; local_628 < 3; local_628 = local_628 + 1) {
        for (local_62c = 0; local_62c < 2; local_62c = local_62c + 1) {
          pdVar10 = TPZFMatrix<double>::operator()
                              (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                               (int64_t)in_stack_ffffffffffffe2e8,(int64_t)in_stack_ffffffffffffe2e0
                              );
          dVar1 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()
                              (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                               (int64_t)in_stack_ffffffffffffe2e8,(int64_t)in_stack_ffffffffffffe2e0
                              );
          dVar2 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()
                              (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                               (int64_t)in_stack_ffffffffffffe2e8,(int64_t)in_stack_ffffffffffffe2e0
                              );
          *pdVar10 = dVar1 * dVar2 + *pdVar10;
        }
      }
    }
    local_630 = 0;
    while( true ) {
      side_00 = (int *)(long)local_630;
      iVar9 = TPZBaseMatrix::Rows(local_20);
      if (iVar9 <= (long)side_00) break;
      local_634 = 0;
      while( true ) {
        in_stack_ffffffffffffe560 = (double *)(long)local_634;
        in_stack_ffffffffffffe568 = (TPZVec<double> *)TPZBaseMatrix::Cols(local_20);
        if ((long)in_stack_ffffffffffffe568 <= (long)in_stack_ffffffffffffe560) break;
        in_stack_ffffffffffffe558 =
             (TPZVec<double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_ffffffffffffe2e8,(int64_t)in_stack_ffffffffffffe2e0);
        pp_Var3 = in_stack_ffffffffffffe558->_vptr_TPZVec;
        pdVar10 = TPZFMatrix<double>::operator()
                            (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                             (int64_t)in_stack_ffffffffffffe2e8,(int64_t)in_stack_ffffffffffffe2e0);
        *pdVar10 = (double)pp_Var3;
        local_634 = local_634 + 1;
      }
      local_630 = local_630 + 1;
    }
    local_7d0 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              ((TPZFNMatrix<27,_double> *)in_stack_ffffffffffffe310,
               (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
               in_stack_ffffffffffffe2f8);
    TPZVec<TPZFMatrix<double>_>::TPZVec
              (in_stack_ffffffffffffe340,(int64_t)in_stack_ffffffffffffe338,
               in_stack_ffffffffffffe330);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16a20dd);
    local_968 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              ((TPZFNMatrix<27,_double> *)in_stack_ffffffffffffe310,
               (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
               in_stack_ffffffffffffe2f8);
    TPZVec<TPZFMatrix<double>_>::TPZVec
              (in_stack_ffffffffffffe340,(int64_t)in_stack_ffffffffffffe338,
               in_stack_ffffffffffffe330);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16a2133);
    local_a30 = 0;
    TPZManVector<double,_20>::TPZManVector
              (in_stack_ffffffffffffe300,(int64_t)in_stack_ffffffffffffe2f8,
               (double *)in_stack_ffffffffffffe2f0);
    local_ba8 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              ((TPZFNMatrix<27,_double> *)in_stack_ffffffffffffe310,
               (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
               in_stack_ffffffffffffe2f8);
    local_d20 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              ((TPZFNMatrix<27,_double> *)in_stack_ffffffffffffe310,
               (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
               in_stack_ffffffffffffe2f8);
    local_e98 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              ((TPZFNMatrix<27,_double> *)in_stack_ffffffffffffe310,
               (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
               in_stack_ffffffffffffe2f8);
    for (local_e9c = 0; local_e9c < 3; local_e9c = local_e9c + 1) {
      local_ee0 = 0;
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_ffffffffffffe300,
                 (int64_t)in_stack_ffffffffffffe2f8,(double *)in_stack_ffffffffffffe2f0);
      local_ee8 = TPZVec<TPZFMatrix<double>_>::operator[](&local_658,(long)local_e9c);
      local_ef0 = TPZVec<TPZFMatrix<double>_>::operator[](&local_7f0,(long)local_e9c);
      (*(local_ef0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(local_ef0,3,2);
      (*(local_ee8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(local_ee8,3,2);
      local_ef4 = local_e9c + 3;
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_ffffffffffffe2f0,
                 (TPZGeoElSideIndex *)in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
      bVar5 = IsLinearMapping(in_stack_ffffffffffffe378,
                              (int)((ulong)in_stack_ffffffffffffe370 >> 0x20));
      in_stack_ffffffffffffe534 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffe534);
      if ((bVar5) || (iVar6 = TPZGeoElSide::Exists(&local_f10), iVar6 == 0)) {
        in_stack_ffffffffffffe528 =
             (TPZVec<double> *)TPZVec<double>::operator[](local_a28,(long)local_e9c);
        in_stack_ffffffffffffe528->_vptr_TPZVec = (_func_int **)0x0;
        local_f14 = 0x13;
      }
      else {
        TPZManVector<double,_3>::TPZManVector
                  ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2f0,
                   (int64_t)in_stack_ffffffffffffe2e8);
        TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe2e0);
        local_1031 = pztopology::TPZTriangle::CheckProjectionForSingularity<double>
                               ((int *)in_stack_ffffffffffffe2e8,
                                (TPZVec<double> *)in_stack_ffffffffffffe2e0);
        in_stack_ffffffffffffe524 = CONCAT13(local_1031,(int3)in_stack_ffffffffffffe524);
        if ((bool)local_1031) {
          pztopology::TPZTriangle::MapToSide<double>
                    ((int)((ulong)in_stack_ffffffffffffe340 >> 0x20),in_stack_ffffffffffffe338,
                     (TPZVec<double> *)in_stack_ffffffffffffe330,in_stack_ffffffffffffe328);
          MVar7 = pztopology::TPZTriangle::Type(local_ef4);
          local_1038 = MVar7;
          iVar6 = MElementType_NNodes((MElementType)in_stack_ffffffffffffe2d0);
          local_103c = iVar6;
          iVar8 = pztopology::TPZTriangle::SideDimension(0x16a25b6);
          local_1040 = iVar8;
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe2f0,(int64_t)in_stack_ffffffffffffe2e8,
                     (int64_t)in_stack_ffffffffffffe2e0);
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe2f0,(int64_t)in_stack_ffffffffffffe2e8,
                     (int64_t)in_stack_ffffffffffffe2e0);
          GetSideShapeFunction<pzgeom::TPZGeoTriangle>
                    (in_stack_ffffffffffffe534,in_stack_ffffffffffffe528,
                     (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffe524,MVar7),
                     (TPZFMatrix<double> *)CONCAT44(iVar6,iVar8));
          local_12e8 = 0;
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe310,
                     (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
                     in_stack_ffffffffffffe2f8);
          local_13d0 = 0;
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe310,
                     (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
                     in_stack_ffffffffffffe2f8);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2f0,
                     (int64_t)in_stack_ffffffffffffe2e8);
          local_14f0 = 0;
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe310,
                     (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
                     in_stack_ffffffffffffe2f8);
          for (local_14f4 = 0; local_14f4 < local_103c; local_14f4 = local_14f4 + 1) {
            local_14f8 = pztopology::TPZTriangle::SideNodeLocId
                                   ((int)in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2cc);
            for (local_14fc = 0; local_14fc < 3; local_14fc = local_14fc + 1) {
              pdVar10 = TPZFMatrix<double>::operator()
                                  (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                   (int64_t)in_stack_ffffffffffffe2e8,
                                   (int64_t)in_stack_ffffffffffffe2e0);
              dVar1 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()
                                  (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                   (int64_t)in_stack_ffffffffffffe2e8,
                                   (int64_t)in_stack_ffffffffffffe2e0);
              dVar2 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()
                                  (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                   (int64_t)in_stack_ffffffffffffe2e8,
                                   (int64_t)in_stack_ffffffffffffe2e0);
              *pdVar10 = dVar1 * dVar2 + *pdVar10;
            }
            pztopology::TPZTriangle::ParametricDomainNodeCoord
                      ((int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20),
                       (TPZVec<double> *)in_stack_ffffffffffffe2d8);
            for (local_1500 = 0; local_1500 < 2; local_1500 = local_1500 + 1) {
              pdVar10 = TPZVec<double>::operator[](&local_1408,(long)local_1500);
              dVar1 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()
                                  (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                   (int64_t)in_stack_ffffffffffffe2e8,
                                   (int64_t)in_stack_ffffffffffffe2e0);
              dVar2 = *pdVar10;
              pdVar10 = TPZVec<double>::operator[](&local_ed8,(long)local_1500);
              *pdVar10 = dVar1 * dVar2 + *pdVar10;
            }
            for (local_1504 = 0; local_1504 < 3; local_1504 = local_1504 + 1) {
              for (local_1508 = 0; local_1508 < local_1040; local_1508 = local_1508 + 1) {
                pdVar10 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                     (int64_t)in_stack_ffffffffffffe2e8,
                                     (int64_t)in_stack_ffffffffffffe2e0);
                dVar1 = *pdVar10;
                pdVar10 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                     (int64_t)in_stack_ffffffffffffe2e8,
                                     (int64_t)in_stack_ffffffffffffe2e0);
                dVar2 = *pdVar10;
                pdVar10 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                     (int64_t)in_stack_ffffffffffffe2e8,
                                     (int64_t)in_stack_ffffffffffffe2e0);
                *pdVar10 = dVar1 * dVar2 + *pdVar10;
              }
            }
            for (local_150c = 0; local_150c < 2; local_150c = local_150c + 1) {
              for (local_1510 = 0; local_1510 < local_1040; local_1510 = local_1510 + 1) {
                pdVar10 = TPZVec<double>::operator[](&local_1408,(long)local_150c);
                dVar1 = *pdVar10;
                pdVar10 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                     (int64_t)in_stack_ffffffffffffe2e8,
                                     (int64_t)in_stack_ffffffffffffe2e0);
                dVar2 = *pdVar10;
                pdVar10 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                     (int64_t)in_stack_ffffffffffffe2e8,
                                     (int64_t)in_stack_ffffffffffffe2e0);
                *pdVar10 = dVar1 * dVar2 + *pdVar10;
              }
            }
          }
          TPZMatrix<double>::Multiply
                    (&in_stack_ffffffffffffe330->super_TPZMatrix<double>,in_stack_ffffffffffffe328,
                     in_stack_ffffffffffffe320,(int)((ulong)in_stack_ffffffffffffe318 >> 0x20));
          TPZMatrix<double>::Multiply
                    (&in_stack_ffffffffffffe330->super_TPZMatrix<double>,in_stack_ffffffffffffe328,
                     in_stack_ffffffffffffe320,(int)((ulong)in_stack_ffffffffffffe318 >> 0x20));
          local_1550 = 0;
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe300,
                     (int64_t)in_stack_ffffffffffffe2f8,(double *)in_stack_ffffffffffffe2f0);
          TPZVec<double>::operator[](local_a28,(long)local_e9c);
          pztopology::TPZTriangle::BlendFactorForSide<double>
                    (side_00,in_stack_ffffffffffffe568,in_stack_ffffffffffffe560,
                     in_stack_ffffffffffffe558);
          for (local_1554 = 0; local_1554 < 2; local_1554 = local_1554 + 1) {
            pdVar10 = TPZVec<double>::operator[](&local_1548,(long)local_1554);
            dVar1 = *pdVar10;
            pdVar10 = TPZFMatrix<double>::operator()
                                (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                 (int64_t)in_stack_ffffffffffffe2e8,
                                 (int64_t)in_stack_ffffffffffffe2e0);
            *pdVar10 = dVar1;
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
          local_1558 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_ffffffffffffe2d0);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2f0,
                     (int64_t)in_stack_ffffffffffffe2e8);
          TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe2e0);
          bVar5 = MapToNeighSide<double>
                            (in_stack_ffffffffffffe5d8,
                             (int)((ulong)in_stack_ffffffffffffe5d0 >> 0x20),
                             (int)in_stack_ffffffffffffe5d0,
                             (TPZVec<double> *)
                             CONCAT44(in_stack_ffffffffffffe5cc,in_stack_ffffffffffffe5c8),
                             (TPZVec<double> *)
                             CONCAT44(in_stack_ffffffffffffe5c4,in_stack_ffffffffffffe5c0),in_RDI);
          if (bVar5) {
            local_16b0 = 0;
            TPZManVector<double,_3>::TPZManVector
                      ((TPZManVector<double,_3> *)in_stack_ffffffffffffe300,
                       (int64_t)in_stack_ffffffffffffe2f8,(double *)in_stack_ffffffffffffe2f0);
            Neighbour(in_stack_ffffffffffffe2e8,(int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20),
                      in_stack_ffffffffffffe2d8);
            TPZGeoElSide::X((TPZGeoElSide *)in_stack_ffffffffffffe330,
                            (TPZVec<double> *)in_stack_ffffffffffffe328,
                            (TPZVec<double> *)in_stack_ffffffffffffe320);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16a2ef0);
            TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe2e0)
            ;
            Neighbour(in_stack_ffffffffffffe2e8,(int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20),
                      in_stack_ffffffffffffe2d8);
            TPZGeoElSide::GradX(in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,
                                in_stack_ffffffffffffe6c0);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16a2f51);
            for (local_17c4 = 0; local_17c4 < 3; local_17c4 = local_17c4 + 1) {
              pdVar10 = TPZVec<double>::operator[](local_16a8,(long)local_17c4);
              dVar1 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()
                                  (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                   (int64_t)in_stack_ffffffffffffe2e8,
                                   (int64_t)in_stack_ffffffffffffe2e0);
              *pdVar10 = dVar1;
            }
            TPZMatrix<double>::Multiply
                      (&in_stack_ffffffffffffe330->super_TPZMatrix<double>,in_stack_ffffffffffffe328
                       ,in_stack_ffffffffffffe320,(int)((ulong)in_stack_ffffffffffffe318 >> 0x20));
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffe2e0);
            pztopology::TPZTriangle::LowerDimensionSides
                      ((int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_ffffffffffffe2d8,
                       (int)((ulong)in_stack_ffffffffffffe2d0 >> 0x20));
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffe2e0);
            pztopology::TPZTriangle::LowerDimensionSides
                      ((int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_ffffffffffffe2d8);
            iVar9 = TPZVec<int>::NElements(local_1810);
            for (local_185c = (int)iVar9; lVar11 = (long)local_185c,
                iVar9 = TPZVec<int>::NElements(local_1858), lVar11 < iVar9;
                local_185c = local_185c + 1) {
              piVar12 = TPZVec<int>::operator[](local_1858,(long)local_185c);
              local_1860 = *piVar12;
              bVar5 = IsLinearMapping(in_stack_ffffffffffffe378,
                                      (int)((ulong)in_stack_ffffffffffffe370 >> 0x20));
              if (!bVar5) {
                local_1868 = -1.0;
                TPZManVector<double,_3>::TPZManVector
                          ((TPZManVector<double,_3> *)in_stack_ffffffffffffe300,
                           (int64_t)in_stack_ffffffffffffe2f8,(double *)in_stack_ffffffffffffe2f0);
                TPZFNMatrix<3,_double>::TPZFNMatrix
                          ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffe310,
                           (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
                           in_stack_ffffffffffffe2f8);
                pztopology::TPZTriangle::BlendFactorForSide<double>
                          (side_00,in_stack_ffffffffffffe568,in_stack_ffffffffffffe560,
                           in_stack_ffffffffffffe558);
                TPZFNMatrix<3,_double>::TPZFNMatrix
                          ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffe310,
                           (int64_t)in_stack_ffffffffffffe308,(int64_t)in_stack_ffffffffffffe300,
                           in_stack_ffffffffffffe2f8);
                for (local_1a1c = 0; local_1a1c < 2; local_1a1c = local_1a1c + 1) {
                  pdVar10 = TPZVec<double>::operator[](&local_18a0,(long)local_1a1c);
                  dVar1 = *pdVar10;
                  pdVar10 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                       (int64_t)in_stack_ffffffffffffe2e8,
                                       (int64_t)in_stack_ffffffffffffe2e0);
                  *pdVar10 = dVar1;
                }
                TPZMatrix<double>::Multiply
                          (&in_stack_ffffffffffffe330->super_TPZMatrix<double>,
                           in_stack_ffffffffffffe328,in_stack_ffffffffffffe320,
                           (int)((ulong)in_stack_ffffffffffffe318 >> 0x20));
                in_stack_ffffffffffffe5d8 =
                     (TPZGeoBlend<pzgeom::TPZGeoTriangle> *)
                     TPZVec<TPZFMatrix<double>_>::operator[](&local_658,(long)(local_1860 + -3));
                in_stack_ffffffffffffe5d0 =
                     TPZVec<TPZFMatrix<double>_>::operator[](&local_7f0,(long)(local_1860 + -3));
                for (in_stack_ffffffffffffe5cc = 0; dVar1 = local_1868,
                    in_stack_ffffffffffffe5cc < 3;
                    in_stack_ffffffffffffe5cc = in_stack_ffffffffffffe5cc + 1) {
                  pdVar10 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                       (int64_t)in_stack_ffffffffffffe2e8,
                                       (int64_t)in_stack_ffffffffffffe2e0);
                  dVar2 = *pdVar10;
                  pdVar10 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                       (int64_t)in_stack_ffffffffffffe2e8,
                                       (int64_t)in_stack_ffffffffffffe2e0);
                  dVar4 = *pdVar10;
                  pdVar10 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                       (int64_t)in_stack_ffffffffffffe2e8,
                                       (int64_t)in_stack_ffffffffffffe2e0);
                  *pdVar10 = -dVar1 * (dVar2 - dVar4) + *pdVar10;
                  for (in_stack_ffffffffffffe5c8 = 0; dVar1 = local_1868,
                      in_stack_ffffffffffffe5c8 < 2;
                      in_stack_ffffffffffffe5c8 = in_stack_ffffffffffffe5c8 + 1) {
                    pdVar10 = TPZFMatrix<double>::operator()
                                        (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                         (int64_t)in_stack_ffffffffffffe2e8,
                                         (int64_t)in_stack_ffffffffffffe2e0);
                    dVar2 = *pdVar10;
                    pdVar10 = TPZFMatrix<double>::operator()
                                        (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                         (int64_t)in_stack_ffffffffffffe2e8,
                                         (int64_t)in_stack_ffffffffffffe2e0);
                    in_stack_ffffffffffffe378 =
                         (TPZGeoBlend<pzgeom::TPZGeoTriangle> *)(dVar2 - *pdVar10);
                    pdVar10 = TPZFMatrix<double>::operator()
                                        (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                         (int64_t)in_stack_ffffffffffffe2e8,
                                         (int64_t)in_stack_ffffffffffffe2e0);
                    *pdVar10 = *pdVar10 - dVar1 * (double)in_stack_ffffffffffffe378;
                    in_stack_ffffffffffffe370 =
                         TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe2e8,
                                    (int64_t)in_stack_ffffffffffffe2e0);
                    dVar1 = *in_stack_ffffffffffffe370;
                    pdVar10 = TPZFMatrix<double>::operator()
                                        (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                         (int64_t)in_stack_ffffffffffffe2e8,
                                         (int64_t)in_stack_ffffffffffffe2e0);
                    dVar2 = *pdVar10;
                    pdVar10 = TPZFMatrix<double>::operator()
                                        (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                         (int64_t)in_stack_ffffffffffffe2e8,
                                         (int64_t)in_stack_ffffffffffffe2e0);
                    in_stack_ffffffffffffe340 = (TPZVec<TPZFMatrix<double>_> *)(dVar2 - *pdVar10);
                    pdVar10 = TPZFMatrix<double>::operator()
                                        (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                         (int64_t)in_stack_ffffffffffffe2e8,
                                         (int64_t)in_stack_ffffffffffffe2e0);
                    *pdVar10 = -dVar1 * (double)in_stack_ffffffffffffe340 + *pdVar10;
                  }
                }
                TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x16a3798);
                TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x16a37a5);
                TPZManVector<double,_3>::~TPZManVector
                          ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
              }
            }
            for (in_stack_ffffffffffffe5c4 = 0; in_stack_ffffffffffffe5c4 < 3;
                in_stack_ffffffffffffe5c4 = in_stack_ffffffffffffe5c4 + 1) {
              for (in_stack_ffffffffffffe5c0 = 0; in_stack_ffffffffffffe5c0 < 2;
                  in_stack_ffffffffffffe5c0 = in_stack_ffffffffffffe5c0 + 1) {
                in_stack_ffffffffffffe338 =
                     (TPZVec<double> *)TPZVec<double>::operator[](local_a28,(long)local_e9c);
                in_stack_ffffffffffffe328 =
                     (TPZFMatrix<double> *)in_stack_ffffffffffffe338->_vptr_TPZVec;
                in_stack_ffffffffffffe330 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                in_stack_ffffffffffffe318 =
                     (in_stack_ffffffffffffe330->super_TPZMatrix<double>).super_TPZBaseMatrix.
                     super_TPZSavable._vptr_TPZSavable;
                in_stack_ffffffffffffe320 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                in_stack_ffffffffffffe308 =
                     (TPZFMatrix<double> *)
                     ((double)in_stack_ffffffffffffe318 -
                     (double)(in_stack_ffffffffffffe320->super_TPZMatrix<double>).
                             super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
                in_stack_ffffffffffffe310 =
                     (TPZFNMatrix<45,_double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                (in_stack_ffffffffffffe310->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffe328 * (double)in_stack_ffffffffffffe308 +
                     (double)(in_stack_ffffffffffffe310->super_TPZFMatrix<double>).
                             super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                             _vptr_TPZSavable);
                in_stack_ffffffffffffe300 =
                     (TPZManVector<double,_20> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                in_stack_ffffffffffffe2f0 =
                     (TPZFNMatrix<9,_double> *)
                     (in_stack_ffffffffffffe300->super_TPZVec<double>)._vptr_TPZVec;
                in_stack_ffffffffffffe2f8 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffe2f0,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                in_stack_ffffffffffffe2e0 = (TPZGeoMesh *)*in_stack_ffffffffffffe2f8;
                in_stack_ffffffffffffe2e8 =
                     (TPZGeoBlend<pzgeom::TPZGeoTriangle> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                in_stack_ffffffffffffe2d0 =
                     (TPZManVector<double,_20> *)
                     ((double)in_stack_ffffffffffffe2e0 -
                     (double)(in_stack_ffffffffffffe2e8->super_TPZGeoTriangle).
                             super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
                             super_TPZSavable._vptr_TPZSavable);
                in_stack_ffffffffffffe2d8 =
                     (TPZGeoMesh *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe2f0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe2e8,
                                (int64_t)in_stack_ffffffffffffe2e0);
                (in_stack_ffffffffffffe2d8->super_TPZSavable)._vptr_TPZSavable =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffe2f0 * (double)in_stack_ffffffffffffe2d0 +
                     (double)(in_stack_ffffffffffffe2d8->super_TPZSavable)._vptr_TPZSavable);
              }
            }
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x16a3a20);
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x16a3a2d);
            TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3a3a);
            TPZManVector<double,_3>::~TPZManVector
                      ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
            local_f14 = 0;
          }
          else {
            local_f14 = 0x13;
          }
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3a5f);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3a79);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3a93);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3aa0);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3aad);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3aba);
        }
        else {
          local_f14 = 0x13;
        }
        TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3ac7);
        TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0)
        ;
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16a3ae1);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
    }
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16a3bf4);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16a3c01);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16a3c0e);
    TPZManVector<double,_20>::~TPZManVector(in_stack_ffffffffffffe2d0);
    TPZVec<TPZFMatrix<double>_>::~TPZVec((TPZVec<TPZFMatrix<double>_> *)in_stack_ffffffffffffe2f0);
    TPZVec<TPZFMatrix<double>_>::~TPZVec((TPZVec<TPZFMatrix<double>_> *)in_stack_ffffffffffffe2f0);
    TPZFNMatrix<45,_double>::~TPZFNMatrix((TPZFNMatrix<45,_double> *)0x16a3c42);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3c4f);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a3c5c);
  }
  else {
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_ffffffffffffe2f0,
               (int64_t)in_stack_ffffffffffffe2e8);
    TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe2e0);
    bVar5 = MapToNeighSide<double>
                      (in_stack_ffffffffffffe5d8,(int)((ulong)in_stack_ffffffffffffe5d0 >> 0x20),
                       (int)in_stack_ffffffffffffe5d0,
                       (TPZVec<double> *)
                       CONCAT44(in_stack_ffffffffffffe5cc,in_stack_ffffffffffffe5c8),
                       (TPZVec<double> *)
                       CONCAT44(in_stack_ffffffffffffe5c4,in_stack_ffffffffffffe5c0),in_RDI);
    if (!bVar5) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6e8);
    }
    TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffe2e0);
    Neighbour(in_stack_ffffffffffffe2e8,(int)((ulong)in_stack_ffffffffffffe2e0 >> 0x20),
              in_stack_ffffffffffffe2d8);
    TPZGeoElSide::GradX(in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,
                        in_stack_ffffffffffffe6c0);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16a1c6b);
    TPZMatrix<double>::Multiply
              (&in_stack_ffffffffffffe330->super_TPZMatrix<double>,in_stack_ffffffffffffe328,
               in_stack_ffffffffffffe320,iVar6);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a1c99);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16a1ca6);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_ffffffffffffe2d0);
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &xiInterior, TPZFMatrix<T> &gradx) const {

    TPZGeoEl &gel = *fGeoEl;
    TPZGeoMesh *gmesh = gel.Mesh();
#ifdef PZ_LOG
    const auto VAL_WIDTH = 10;
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {   soutLogDebug<<"======================_______REF_1"<<std::endl;
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::GradX"<<std::endl;
        soutLogDebug << "element id " <<gel.Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xiInterior.size(); i++) soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<xiInterior[i]<<"\t";
        soutLogDebug<<std::endl;
    }
#endif
    const REAL zero = 1e-14;
    gradx.Redim(3,TGeo::Dimension);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(TGeo::NSides-1, gmesh).GradX(neighXi, gradNeigh);
        gradNeigh.Multiply(dNeighXiDXi,gradx);//gradNonLinSide = gradNeigh.dNeighXiDXi
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1), dPhiDxi(TGeo::Dimension, TGeo::NNodes);
    TGeo::TShape(xiInterior, phi, dPhiDxi);//gets the barycentric coordinates


    TPZFNMatrix<45,T> gradXLin(3, TGeo::Dimension,(T)0);
    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for(int x = 0; x < 3; x++) {
            for (int xi = 0; xi < TGeo::Dimension; xi++) {
                gradXLin(x, xi) += coord(x, iNode) * dPhiDxi(xi, iNode);
            }
        }
    }
    for(int i = 0; i < gradx.Rows(); i++){
        for(int j = 0; j < gradx.Cols(); j++){
            gradx(i,j) = gradXLin(i,j);
        }
    }

#ifdef PZ_LOG
    soutLogDebug<<"FIRST TERM"<<std::endl;
    soutLogDebug << "gradient of linear mapping:\n";
    if (logger.isDebugEnabled()) {
        for (int i = 0; i < gradXLin.Rows(); i++) {
            for (int j = 0; j < gradXLin.Cols(); j++) {
                soutLogDebug << std::setw(VAL_WIDTH) << std::right << gradXLin(i, j);
                if (j != gradXLin.Cols() - 1) soutLogDebug << "\t";
            }
            soutLogDebug << std::endl;
        }
    }

#endif
    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */

    TPZVec<TPZFMatrix<T> > gradNonLinSideVec(TGeo::NSides - TGeo::NNodes,
                                             TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZVec<TPZFMatrix<T> > gradLinSideVec(TGeo::NSides - TGeo::NNodes,
                                          TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, (T)0);
    TPZFNMatrix<27,T> dCorrFactorDxi(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, (T) 0);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        TPZManVector<T, 3> xiProjectedOverSide(TGeo::Dimension, 0);
        TPZFMatrix<T> &gradNonLinSide = gradNonLinSideVec[sideIndex];
        TPZFMatrix<T> &gradLinSide = gradLinSideVec[sideIndex];
        gradLinSide.Redim(3,TGeo::Dimension);
        gradNonLinSide.Redim(3,TGeo::Dimension);

        int side = TGeo::NNodes + sideIndex;
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "================================" << std::endl;
            soutLogDebug << "side: " << side << " is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                if (IsLinearMapping(side)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false (no gelside) " << std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "false (gelside exists) " << std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3> sideXi;
        TPZFNMatrix<9, T> transfXiToSideXi;
        bool regularMap = TGeo::CheckProjectionForSingularity(side, xiInterior);
        if (!regularMap) {
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }

        this->MapToSide(side, xiInterior, sideXi, transfXiToSideXi);
        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        const int sideDim = TGeo::SideDimension(side);
        TPZFNMatrix<9, T> sidePhiVec(nSideNodes, 1),
                dSidePhiDSideXiVec(sideDim, nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhiVec, dSidePhiDSideXiVec);

        TPZFNMatrix<9, T> dXprojDxiSide(TGeo::Dimension,sideDim,(T)0),
                dXiProjectedOverSideDxi(TGeo::Dimension,TGeo::Dimension,(T)0);
        TPZManVector<REAL, 3> nodeCoord;
        //calculation of transformation for the derivatives of sidephi
        
        TPZFNMatrix<9, T> gradLinSideXiSide(3,sideDim,(T)0);
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhiVec(iNode, 0);
            }

            TGeo::ParametricDomainNodeCoord(currentNode, nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                xiProjectedOverSide[x] += nodeCoord[x] * sidePhiVec(iNode, 0);
            }

            for(int x = 0; x < 3; x++){
                for(int xi = 0; xi < sideDim; xi++) {
                    gradLinSideXiSide(x,xi) += coord(x, currentNode) * dSidePhiDSideXiVec(xi,iNode);
                }
            }

            for (int i = 0; i < TGeo::Dimension; i++) {
                for (int j = 0; j < sideDim; j++) {
                    dXprojDxiSide(i,j) += nodeCoord[i] * dSidePhiDSideXiVec(j,iNode);
                }
            }

        }

        gradLinSideXiSide.Multiply(transfXiToSideXi,gradLinSide);//gradLinSideTemp = gradLinSideXiSide.transfXiToSideXi
        dXprojDxiSide.Multiply(transfXiToSideXi,dXiProjectedOverSideDxi);//dXprojDxiTemp = dXprojDxiSide.transfXiToSideXi

        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "xi projection over side: ";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug << xiProjectedOverSide[x] << "\t";
            soutLogDebug << "\nGrad of projected point to side:\n";
            for(int i = 0; i < dXiProjectedOverSideDxi.Rows(); i++){
                for(int j = 0; j < dXiProjectedOverSideDxi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dXiProjectedOverSideDxi(i,j);
                    if(j != dXiProjectedOverSideDxi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "xi projection in side domain:";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug << sideXi[x] << "\t";
            soutLogDebug << "\nTransformation from x side to xi interior:\n";
            for(int i = 0; i < transfXiToSideXi.Rows(); i++){
                for(int j = 0; j < transfXiToSideXi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<transfXiToSideXi(i,j);
                    if(j != transfXiToSideXi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "\nLinear mapping of projected point: ";
            for (int x = 0; x < 3; x++) soutLogDebug << linearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of linear mapping of point projected to side:\n";
            for(int i = 0; i < gradLinSide.Rows(); i++){
                for(int j = 0; j < gradLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradLinSide(i,j);
                    if(j != gradLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
        }
        #endif
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        {
            TPZManVector<T,3> dCorrFactor(TGeo::Dimension,(T)0);
            TGeo::BlendFactorForSide(side, xiInterior, blendFactor[sideIndex], dCorrFactor);
            for(int iXi = 0; iXi < TGeo::Dimension; iXi++){
                dCorrFactorDxi(sideIndex,iXi) = dCorrFactor[iXi];
            }
        }

        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(side, sidedim, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        Neighbour(side, gmesh).X(neighXi, Xside);
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(side, gmesh).GradX(neighXi,gradNeigh);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }
        gradNeigh.Multiply(dNeighXiDXi,gradNonLinSide);//gradNonLinSide = gradNeigh.dNeighXiDXi

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
//            TPZFNMatrix<9, T> gradNonLinSubSide(3,TGeo::Dimension,(T)0);
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if (IsLinearMapping(subSide)) continue;

            T blendFactorSide = -1;
            TPZManVector<T,3> dCorrFactorSideDxiProj(TGeo::Dimension,(T)0);
            TPZFNMatrix<3, T> dCorrFactorSideDxi(TGeo::Dimension,1,(T)0);
            TGeo::BlendFactorForSide(subSide, xiProjectedOverSide, blendFactorSide, dCorrFactorSideDxiProj);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            TPZFNMatrix<3, T> dCorrFactorSideDxiProjMat(1,TGeo::Dimension,(T)0);
            for(int xi = 0; xi < TGeo::Dimension; xi++){
                dCorrFactorSideDxiProjMat(0,xi) = dCorrFactorSideDxiProj[xi];
            }

//                 dCorrFactorSideDxi = dXiProjectedOverSideDxi. dCorrFactorSideDxiProjMat
//                dXiProjectedOverSideDxi.Multiply(dCorrFactorSideDxiProjMat,dCorrFactorSideDxi);//mostrarphil

//                dCorrFactorSideDxi = dCorrFactorSideDxiProjMat . dXiProjectedOverSideDxi;
            dCorrFactorSideDxiProjMat.Multiply(dXiProjectedOverSideDxi,dCorrFactorSideDxi);
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\n\tGrad of correction factor of point projected to side:\n";
                for(int i = 0; i < dCorrFactorSideDxi.Rows(); i++){
                    soutLogDebug<<"\t";
                    for(int j = 0; j < dCorrFactorSideDxi.Cols(); j++){
                        soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dCorrFactorSideDxi(i,j);
                        if(j != dCorrFactorSideDxi.Cols() - 1) soutLogDebug<<"\t";
                    }
                    soutLogDebug<<std::endl;
                }
            }
            #endif
            TPZFMatrix<T> &gradNonLinSubSide = gradNonLinSideVec[subSide - TGeo::NNodes];
            TPZFMatrix<T> &gradLinSubSide = gradLinSideVec[subSide - TGeo::NNodes];
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
                for (int j = 0; j < TGeo::Dimension; j++) {
                    gradNonLinSide(x,j) -= blendFactorSide *  (gradNonLinSubSide(x,j)-gradLinSubSide(x,j));
                    gradNonLinSide(x,j) -= dCorrFactorSideDxi(0,j) *
                                           (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                                            linearSideMappings(subSide - TGeo::NNodes, x));
                }
            }
        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping: ";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of non-linear mapping:\n";
            for(int i = 0; i < gradNonLinSide.Rows(); i++){
                for(int j = 0; j < gradNonLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradNonLinSide(i,j);
                    if(j != gradNonLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl;
            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tcorrection factor: " << blendFactor[sideIndex] << std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi: ";
            for(int i = 0; i < TGeo::Dimension; i++) soutLogDebug<<dCorrFactorDxi(sideIndex,i)<<"\t";
            soutLogDebug << "\n";

            soutLogDebug<<"SECOND TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tblendFactor *  (gradNonLinSide-gradLinSide): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }
            soutLogDebug<<"THIRD TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi *\n"
                            "                              (nonLinearSideMappings -\n"
                            "                               linearSideMappings): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = dCorrFactorDxi(sideIndex,j) *
                                  (nonLinearSideMappings(sideIndex, i) -
                                   linearSideMappings(sideIndex,i));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }

            soutLogDebug<<std::endl;
        }
#endif

        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < TGeo::Dimension; j++) {
                gradx(i,j) += blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                gradx(i,j) += dCorrFactorDxi(sideIndex,j) *
                              (nonLinearSideMappings(sideIndex, i) -
                               linearSideMappings(sideIndex,i));
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for(int i = 0; i < gradx.Rows(); i++){
            for(int j = 0; j < gradx.Cols(); j++){
                soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradx(i,j);
                if(j != gradx.Cols() - 1) soutLogDebug<<"\t";
            }
            soutLogDebug<<std::endl;
        }
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
#ifdef PZDEBUG
    for(int i = 0; i < gradx.Rows();i++){
        for(int j = 0; j < gradx.Cols(); j++) {
            if (std::isnan(TPZExtractVal::val(gradx(i,j)))) {
                DebugStop();
            }
        }
    }
#endif

}